

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O0

Remotes * Omega_h::globals_to_linear_owners
                    (Remotes *__return_storage_ptr__,Read<long> *globals,GO total,I32 comm_size)

{
  void *pvVar1;
  void *pvVar2;
  Write<int> local_1b0;
  Read<int> local_1a0;
  Write<int> local_190;
  Read<int> local_180;
  undefined1 local_170 [8];
  type f;
  string local_120 [32];
  undefined1 local_100 [8];
  Write<int> idxs;
  allocator local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  Write<int> ranks;
  GO split;
  GO rem;
  GO quot;
  GO comm_size_gt;
  I32 comm_size_local;
  GO total_local;
  Read<long> *globals_local;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  pvVar1 = (void *)(total / (long)comm_size);
  pvVar2 = (void *)(total % (long)comm_size);
  ranks.shared_alloc_.direct_ptr = (void *)(((long)pvVar1 + 1) * (long)pvVar2);
  if (((ulong)(globals->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((globals->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(globals->write_).shared_alloc_.alloc >> 3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"",&local_d9);
  Write<int>::Write((Write<int> *)local_b8,(LO)(local_10 >> 3),(string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  if (((ulong)(globals->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((globals->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(globals->write_).shared_alloc_.alloc >> 3;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"",(allocator *)((long)&f.rem + 7));
  Write<int>::Write((Write<int> *)local_100,(LO)(local_20 >> 3),(string *)local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.rem + 7));
  Read<long>::Read((Read<long> *)local_170,(Read<int> *)globals);
  f.globals.write_.shared_alloc_.direct_ptr = ranks.shared_alloc_.direct_ptr;
  Write<int>::Write((Write<int> *)&f.split,(Write<int> *)local_b8);
  f.ranks.shared_alloc_.direct_ptr = pvVar1;
  Write<int>::Write((Write<int> *)&f.quot,(Write<int> *)local_100);
  if (((ulong)(globals->write_).shared_alloc_.alloc & 1) == 0) {
    local_30 = ((globals->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_30 = (ulong)(globals->write_).shared_alloc_.alloc >> 3;
  }
  f.idxs.shared_alloc_.direct_ptr = pvVar2;
  parallel_for<Omega_h::globals_to_linear_owners(Omega_h::Read<long>,long,int)::__0>
            ((LO)(local_30 >> 3),(type *)local_170);
  Write<int>::Write(&local_190,(Write<int> *)local_b8);
  Read<int>::Read(&local_180,&local_190);
  Write<int>::Write(&local_1b0,(Write<int> *)local_100);
  Read<int>::Read(&local_1a0,&local_1b0);
  Remotes::Remotes(__return_storage_ptr__,&local_180,&local_1a0);
  Read<int>::~Read(&local_1a0);
  Write<int>::~Write(&local_1b0);
  Read<int>::~Read(&local_180);
  Write<int>::~Write(&local_190);
  globals_to_linear_owners(Omega_h::Read<long>,long,int)::$_0::~__0((__0 *)local_170);
  Write<int>::~Write((Write<int> *)local_100);
  Write<int>::~Write((Write<int> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

Remotes globals_to_linear_owners(Read<GO> globals, GO total, I32 comm_size) {
  auto const comm_size_gt = GO(comm_size);
  auto const quot = total / comm_size_gt;
  auto const rem = total % comm_size_gt;
  auto const split = ((quot + 1) * rem);
  Write<I32> ranks(globals.size());
  Write<LO> idxs(globals.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    if (globals[i] < split) {
      ranks[i] = static_cast<I32>(globals[i] / (quot + 1));
      idxs[i] = static_cast<LO>(globals[i] % (quot + 1));
    } else {
      auto const g = globals[i] - split;
      ranks[i] = static_cast<I32>(g / quot + rem);
      idxs[i] = static_cast<LO>(g % quot);
    }
  };
  parallel_for(globals.size(), std::move(f));
  return Remotes(ranks, idxs);
}